

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

int verifyMerkleTree(tree_t *tree,uint8_t **leafData,uint8_t *salt,picnic_instance_t *params)

{
  uint uVar1;
  uint8_t *__src;
  _Bool _Var2;
  ulong uVar3;
  uint i;
  ulong uVar4;
  uint i_00;
  uint uVar5;
  
  uVar5 = tree->numNodes;
  uVar1 = tree->numLeaves;
  uVar3 = (ulong)uVar1;
  uVar4 = 0;
  do {
    if (uVar3 <= uVar4) {
      uVar5 = tree->numNodes;
      while (uVar5 != 0) {
        computeParentHash(tree,uVar5,salt,params);
        uVar5 = uVar5 - 1;
      }
      return (((uint)*tree->haveNodeExists >> 1 & 1) != 0) - 1;
    }
    __src = leafData[uVar4];
    if (__src != (uint8_t *)0x0) {
      i_00 = (uVar5 - uVar1) + (int)uVar4;
      _Var2 = haveNode(tree,i_00);
      if (_Var2) {
        return -1;
      }
      memcpy(tree->nodes + tree->dataSize * i_00,__src,(ulong)tree->dataSize);
      markNode(tree,i_00);
      uVar3 = (ulong)tree->numLeaves;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int verifyMerkleTree(tree_t* tree, /* uint16_t* missingLeaves, size_t missingLeavesSize, */
                     uint8_t** leafData, uint8_t* salt, const picnic_instance_t* params) {
  unsigned int firstLeaf = tree->numNodes - tree->numLeaves;

  /* Copy the leaf data, where we have it. The actual data being committed to has already been
   * hashed, according to the spec. */
  for (unsigned int i = 0; i < tree->numLeaves; i++) {
    if (leafData[i] != NULL) {
      if (haveNode(tree, firstLeaf + i)) {
        return -1; /* A leaf was assigned from the prover for a node we've recomputed */
      }

      memcpy(&tree->nodes[(firstLeaf + i) * tree->dataSize], leafData[i], tree->dataSize);
      markNode(tree, firstLeaf + i);
    }
  }

  /* At this point the tree has some of the leaves, and some intermediate nodes
   * Work up the tree, computing all nodes we don't have that are missing. */
  for (unsigned int i = tree->numNodes; i > 0; i--) {
    computeParentHash(tree, i, salt, params);
  }

  /* Fail if the root was not computed. */
  if (!haveNode(tree, 0)) {
    return -1;
  }

  return 0;
}